

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_timer_thread_stats.cpp
# Opt level: O0

void __thiscall
so_5::stats::impl::ds_timer_thread_stats_t::distribute
          (ds_timer_thread_stats_t *this,mbox_t *distribution_mbox)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  suffix_t local_98;
  prefix_t local_90;
  suffix_t local_60;
  prefix_t local_58;
  unsigned_long local_28;
  timer_thread_stats_t stats;
  mbox_t *distribution_mbox_local;
  ds_timer_thread_stats_t *this_local;
  
  stats.m_periodic_count = (size_t)distribution_mbox;
  iVar2 = (*this->m_what->_vptr_environment_infrastructure_t[0xe])();
  sVar1 = stats.m_periodic_count;
  local_28 = CONCAT44(extraout_var,iVar2);
  prefixes::timer_thread();
  local_60 = suffixes::timer_single_shot_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long_const&>
            ((intrusive_ptr_t<so_5::abstract_message_box_t> *)sVar1,&local_58,&local_60,&local_28);
  sVar1 = stats.m_periodic_count;
  prefixes::timer_thread();
  local_98 = suffixes::timer_periodic_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long_const&>
            ((intrusive_ptr_t<so_5::abstract_message_box_t> *)sVar1,&local_90,&local_98,
             &stats.m_single_shot_count);
  return;
}

Assistant:

void
ds_timer_thread_stats_t::distribute(
	const mbox_t & distribution_mbox )
	{
		const auto stats = m_what.query_timer_thread_stats();

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::timer_thread(),
				suffixes::timer_single_shot_count(),
				stats.m_single_shot_count );

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::timer_thread(),
				suffixes::timer_periodic_count(),
				stats.m_periodic_count );
	}